

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

Preprocessor *
preprocessor_start(char *fname,char *source,uint sourcelen,MOJOSHADER_includeOpen open_callback,
                  MOJOSHADER_includeClose close_callback,MOJOSHADER_preprocessorDefine *defines,
                  uint define_count,int asm_comments,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  int iVar1;
  StringCache *pSVar2;
  Define *pDVar3;
  char *pcVar4;
  Buffer *buffer;
  size_t sVar5;
  bool bVar6;
  bool local_6f;
  bool local_6e;
  bool local_6c;
  bool local_6b;
  Buffer *predefbuf;
  char *pcStack_58;
  uint define_include_len;
  char *define_include;
  Context_conflict1 *ctx;
  uint i;
  int okay;
  MOJOSHADER_preprocessorDefine *defines_local;
  MOJOSHADER_includeClose close_callback_local;
  MOJOSHADER_includeOpen open_callback_local;
  uint sourcelen_local;
  char *source_local;
  char *fname_local;
  
  if (m == (MOJOSHADER_malloc)0x0) {
    __assert_fail("m != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x26b,
                  "Preprocessor *preprocessor_start(const char *, const char *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose, const MOJOSHADER_preprocessorDefine *, unsigned int, int, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                 );
  }
  if (f == (MOJOSHADER_free)0x0) {
    __assert_fail("f != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x26c,
                  "Preprocessor *preprocessor_start(const char *, const char *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose, const MOJOSHADER_preprocessorDefine *, unsigned int, int, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                 );
  }
  fname_local = (char *)(*m)(0x978,d);
  if ((Context_conflict1 *)fname_local == (Context_conflict1 *)0x0) {
    fname_local = (char *)0x0;
  }
  else {
    memset(fname_local,0,0x978);
    ((Context_conflict1 *)fname_local)->malloc = m;
    ((Context_conflict1 *)fname_local)->free = f;
    ((Context_conflict1 *)fname_local)->malloc_data = d;
    ((Context_conflict1 *)fname_local)->open_callback = open_callback;
    ((Context_conflict1 *)fname_local)->close_callback = close_callback;
    ((Context_conflict1 *)fname_local)->asm_comments = asm_comments;
    pSVar2 = stringcache_create(MallocBridge,FreeBridge,fname_local);
    ((Context_conflict1 *)fname_local)->filename_cache = pSVar2;
    pSVar2 = ((Context_conflict1 *)fname_local)->filename_cache;
    pDVar3 = get_define((Context_conflict1 *)fname_local);
    ((Context_conflict1 *)fname_local)->file_macro = pDVar3;
    bVar6 = false;
    if (pSVar2 != (StringCache *)0x0) {
      bVar6 = ((Context_conflict1 *)fname_local)->file_macro != (Define *)0x0;
    }
    if ((bVar6) && (((Context_conflict1 *)fname_local)->file_macro != (Define *)0x0)) {
      pcVar4 = StrDup((Context_conflict1 *)fname_local,"__FILE__");
      ((Context_conflict1 *)fname_local)->file_macro->identifier = pcVar4;
      bVar6 = pcVar4 != (char *)0x0;
    }
    pDVar3 = get_define((Context_conflict1 *)fname_local);
    ((Context_conflict1 *)fname_local)->line_macro = pDVar3;
    local_6b = false;
    if (bVar6) {
      local_6b = ((Context_conflict1 *)fname_local)->line_macro != (Define *)0x0;
    }
    ctx._4_4_ = (uint)local_6b;
    if ((ctx._4_4_ != 0) && (((Context_conflict1 *)fname_local)->line_macro != (Define *)0x0)) {
      pcVar4 = StrDup((Context_conflict1 *)fname_local,"__LINE__");
      ((Context_conflict1 *)fname_local)->line_macro->identifier = pcVar4;
      ctx._4_4_ = (uint)(pcVar4 != (char *)0x0);
    }
    pcStack_58 = (char *)0x0;
    predefbuf._4_4_ = 0;
    if ((ctx._4_4_ != 0) && (define_count != 0)) {
      buffer = buffer_create(0x100,MallocBridge,FreeBridge,fname_local);
      local_6c = ctx._4_4_ != 0 && buffer != (Buffer *)0x0;
      for (ctx._0_4_ = 0; ctx._4_4_ = (uint)local_6c, ctx._4_4_ != 0 && (uint)ctx < define_count;
          ctx._0_4_ = (uint)ctx + 1) {
        local_6e = false;
        if (ctx._4_4_ != 0) {
          iVar1 = buffer_append_fmt(buffer,"#define %s %s\n",defines[(uint)ctx].identifier,
                                    defines[(uint)ctx].definition);
          local_6e = iVar1 != 0;
        }
        local_6c = local_6e;
      }
      sVar5 = buffer_size(buffer);
      predefbuf._4_4_ = (uint)sVar5;
      if (predefbuf._4_4_ != 0) {
        pcStack_58 = buffer_flatten(buffer);
        local_6f = ctx._4_4_ != 0 && pcStack_58 != (char *)0x0;
        ctx._4_4_ = (uint)local_6f;
      }
      buffer_destroy(buffer);
    }
    if ((ctx._4_4_ != 0) &&
       (iVar1 = push_source((Context_conflict1 *)fname_local,fname,source,sourcelen,1,
                            (MOJOSHADER_includeClose)0x0), iVar1 == 0)) {
      ctx._4_4_ = 0;
    }
    if ((ctx._4_4_ != 0) && (predefbuf._4_4_ != 0)) {
      if (pcStack_58 == (char *)0x0) {
        __assert_fail("define_include != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x2a2,
                      "Preprocessor *preprocessor_start(const char *, const char *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose, const MOJOSHADER_preprocessorDefine *, unsigned int, int, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      ctx._4_4_ = push_source((Context_conflict1 *)fname_local,"<predefined macros>",pcStack_58,
                              predefbuf._4_4_,1,close_define_include);
    }
    if (ctx._4_4_ == 0) {
      preprocessor_end((Preprocessor *)fname_local);
      fname_local = (char *)0x0;
    }
  }
  return (Preprocessor *)fname_local;
}

Assistant:

Preprocessor *preprocessor_start(const char *fname, const char *source,
                            unsigned int sourcelen,
                            MOJOSHADER_includeOpen open_callback,
                            MOJOSHADER_includeClose close_callback,
                            const MOJOSHADER_preprocessorDefine *defines,
                            unsigned int define_count, int asm_comments,
                            MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    int okay = 1;
    unsigned int i = 0;

    // the preprocessor is internal-only, so we verify all these are != NULL.
    assert(m != NULL);
    assert(f != NULL);

    Context *ctx = (Context *) m(sizeof (Context), d);
    if (ctx == NULL)
        return NULL;

    memset(ctx, '\0', sizeof (Context));
    ctx->malloc = m;
    ctx->free = f;
    ctx->malloc_data = d;
    ctx->open_callback = open_callback;
    ctx->close_callback = close_callback;
    ctx->asm_comments = asm_comments;

    ctx->filename_cache = stringcache_create(MallocBridge, FreeBridge, ctx);
    okay = ((okay) && (ctx->filename_cache != NULL));

    ctx->file_macro = get_define(ctx);
    okay = ((okay) && (ctx->file_macro != NULL));
    if ((okay) && (ctx->file_macro))
        okay = ((ctx->file_macro->identifier = StrDup(ctx, "__FILE__")) != 0);

    ctx->line_macro = get_define(ctx);
    okay = ((okay) && (ctx->line_macro != NULL));
    if ((okay) && (ctx->line_macro))
        okay = ((ctx->line_macro->identifier = StrDup(ctx, "__LINE__")) != 0);

    // let the usual preprocessor parser sort these out.
    char *define_include = NULL;
    unsigned int define_include_len = 0;
    if ((okay) && (define_count > 0))
    {
        Buffer *predefbuf = buffer_create(256, MallocBridge, FreeBridge, ctx);
        okay = okay && (predefbuf != NULL);
        for (i = 0; okay && (i < define_count); i++)
        {
            okay = okay && buffer_append_fmt(predefbuf, "#define %s %s\n",
                                 defines[i].identifier, defines[i].definition);
        } // for

        define_include_len = buffer_size(predefbuf);
        if (define_include_len > 0)
        {
            define_include = buffer_flatten(predefbuf);
            okay = okay && (define_include != NULL);
        } // if
        buffer_destroy(predefbuf);
    } // if

    if ((okay) && (!push_source(ctx,fname,source,sourcelen,1,NULL)))
        okay = 0;

    if ((okay) && (define_include_len > 0))
    {
        assert(define_include != NULL);
        okay = push_source(ctx, "<predefined macros>", define_include,
                           define_include_len, 1, close_define_include);
    } // if

    if (!okay)
    {
        preprocessor_end((Preprocessor *) ctx);
        return NULL;
    } // if

    return (Preprocessor *) ctx;
}